

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::endModule(SymbolData *this,AssemblerFile *file)

{
  if ((this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
      super__Vector_impl_data._M_start[this->currentModule].file != file) {
    return;
  }
  if (this->currentModule != 0) {
    if (this->currentFunction != -1) {
      Logger::printError<>(Error,"Module closed before function end");
      this->currentFunction = -1;
    }
    this->currentModule = 0;
    return;
  }
  Logger::printError<>(Error,"No module opened");
  return;
}

Assistant:

void SymbolData::endModule(AssemblerFile* file)
{
	if (modules[currentModule].file != file)
		return;

	if (currentModule == 0)
	{
		Logger::printError(Logger::Error, "No module opened");
		return;
	}

	if (currentFunction != -1)
	{
		Logger::printError(Logger::Error, "Module closed before function end");
		currentFunction = -1;
	}

	currentModule = 0;
}